

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

char * Json::strnpbrk(char *s,char *accept,size_t n)

{
  bool bVar1;
  char *local_48;
  char *a;
  char *pcStack_38;
  int c;
  char *cur;
  char *end;
  size_t n_local;
  char *accept_local;
  char *s_local;
  
  if ((s != (char *)0x0) || (bVar1 = false, n == 0)) {
    bVar1 = accept != (char *)0x0;
  }
  if (bVar1) {
    pcStack_38 = s;
    do {
      if (s + n <= pcStack_38) {
        return (char *)0x0;
      }
      for (local_48 = accept; *local_48 != '\0'; local_48 = local_48 + 1) {
        if (*local_48 == *pcStack_38) {
          return pcStack_38;
        }
      }
      pcStack_38 = pcStack_38 + 1;
    } while( true );
  }
  __assert_fail("(s || !n) && accept",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Expost[P]SimpleFtpServer/jsoncpp.cpp"
                ,0x10a2,"const char *Json::strnpbrk(const char *, const char *, size_t)");
}

Assistant:

static char const* strnpbrk(char const* s, char const* accept, size_t n) {
  assert((s || !n) && accept);

  char const* const end = s + n;
  for (char const* cur = s; cur < end; ++cur) {
    int const c = *cur;
    for (char const* a = accept; *a; ++a) {
      if (*a == c) {
        return cur;
      }
    }
  }
  return NULL;
}